

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_pigpiod_if2.c
# Opt level: O0

void t4(int pi)

{
  ssize_t sVar1;
  undefined4 in_EDI;
  char p [32];
  gpioReport_t r;
  int toggle_ok;
  int seq_ok;
  int l;
  int b;
  int s;
  int n;
  int f;
  int e;
  int h;
  char *in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffb4;
  int in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  int in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  ushort local_34 [4];
  uint local_2c;
  undefined4 local_28;
  undefined4 local_24;
  uint local_20;
  int local_1c;
  uint local_18;
  int local_14;
  int local_10;
  undefined4 local_c;
  uint local_8;
  undefined4 local_4;
  
  local_4 = in_EDI;
  printf("Pipe notification tests.\n");
  set_PWM_frequency(local_4,0x19,0);
  set_PWM_dutycycle(local_4,0x19,0);
  set_PWM_range(local_4,0x19,100);
  local_8 = notify_open(local_4);
  sprintf(&stack0xffffffffffffffa8,"/dev/pigpio%d",(ulong)local_8);
  local_10 = open(&stack0xffffffffffffffa8,0);
  local_c = notify_begin(local_4,local_8,0x2000000);
  CHECK(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,
        in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,in_stack_ffffffffffffffa8);
  set_PWM_dutycycle(local_4,0x19,0x32);
  time_sleep(0x4010000000000000);
  set_PWM_dutycycle(local_4,0x19,0);
  local_c = notify_pause(local_4,local_8);
  CHECK(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,
        in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,in_stack_ffffffffffffffa8);
  local_c = notify_close(local_4,local_8);
  CHECK(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,
        in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,in_stack_ffffffffffffffa8);
  local_14 = 0;
  local_18 = 0;
  local_20 = 0;
  local_24 = 1;
  local_28 = 1;
  while( true ) {
    sVar1 = read(local_10,local_34,0xc);
    local_1c = (int)sVar1;
    if (local_1c != 0xc) break;
    if (local_18 != local_34[0]) {
      local_24 = 0;
    }
    if ((local_14 != 0) && (local_20 != (local_2c & 0x2000000))) {
      local_28 = 0;
    }
    if ((local_2c & 0x2000000) == 0) {
      local_20 = 0x2000000;
    }
    else {
      local_20 = 0;
    }
    local_18 = local_18 + 1;
    local_14 = local_14 + 1;
    local_1c = 0xc;
  }
  close(local_10);
  CHECK(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,
        in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,in_stack_ffffffffffffffa8);
  CHECK(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,
        in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,in_stack_ffffffffffffffa8);
  CHECK(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,
        in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,in_stack_ffffffffffffffa8);
  return;
}

Assistant:

void t4(int pi)
{
   int h, e, f, n, s, b, l, seq_ok, toggle_ok;
   gpioReport_t r;
   char p[32];

   printf("Pipe notification tests.\n");

   set_PWM_frequency(pi, GPIO, 0);
   set_PWM_dutycycle(pi, GPIO, 0);
   set_PWM_range(pi, GPIO, 100);

   h = notify_open(pi);

   sprintf(p, "/dev/pigpio%d", h);
   f = open(p, O_RDONLY);

   e = notify_begin(pi, h, (1<<GPIO));
   CHECK(4, 1, e, 0, 0, "notify open/begin");

   set_PWM_dutycycle(pi, GPIO, 50);
   time_sleep(4);
   set_PWM_dutycycle(pi, GPIO, 0);

   e = notify_pause(pi, h);
   CHECK(4, 2, e, 0, 0, "notify pause");

   e = notify_close(pi, h);
   CHECK(4, 3, e, 0, 0, "notify close");

   n = 0;
   s = 0;
   l = 0;
   seq_ok = 1;
   toggle_ok = 1;

   while (1)
   {
      b = read(f, &r, 12);
      if (b == 12)
      {
         if (s != r.seqno) seq_ok = 0;

         if (n) if (l != (r.level&(1<<GPIO))) toggle_ok = 0;

         if (r.level&(1<<GPIO)) l = 0;
         else                   l = (1<<GPIO);
           
         s++;
         n++;

         // printf("%d %d %d %X\n", r.seqno, r.flags, r.tick, r.level);
      }
      else break;
   }
   close(f);
 
   CHECK(4, 4, seq_ok, 1, 0, "sequence numbers ok");

   CHECK(4, 5, toggle_ok, 1, 0, "gpio toggled ok");

   CHECK(4, 6, n, 80, 10, "number of notifications");
}